

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

bool __thiscall SimpleString::equalsNoCase(SimpleString *this,SimpleString *str)

{
  byte bVar1;
  SimpleString *in_RDI;
  SimpleString *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  lowerCase(in_RDI);
  lowerCase(in_RDI);
  bVar1 = ::operator==((SimpleString *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                       ,in_stack_ffffffffffffffb8);
  ~SimpleString((SimpleString *)0x17212b);
  ~SimpleString((SimpleString *)0x172135);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SimpleString::equalsNoCase(const SimpleString& str) const
{
    return lowerCase() == str.lowerCase();
}